

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

bool cfd::core::TaprootUtil::VerifyTaprootCommitment
               (bool has_parity,uint8_t tapleaf_bit,SchnorrPubkey *target_taproot,
               SchnorrPubkey *internal_pubkey,
               vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *nodes,
               Script *tapscript,ByteData256 *tapleaf_hash)

{
  Script *this;
  bool bVar1;
  size_type sVar2;
  reference commitment;
  TaprootScriptTree *in_stack_fffffffffffffec0;
  ByteData256 hash;
  ByteData256 *node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *__range2;
  ByteData256 local_f8;
  undefined1 local_e0 [8];
  TaprootScriptTree tree;
  CfdSourceLocation local_48;
  Script *local_30;
  Script *tapscript_local;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *nodes_local;
  SchnorrPubkey *internal_pubkey_local;
  SchnorrPubkey *target_taproot_local;
  uint8_t tapleaf_bit_local;
  bool has_parity_local;
  
  local_30 = tapscript;
  tapscript_local = (Script *)nodes;
  nodes_local = (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                internal_pubkey;
  internal_pubkey_local = target_taproot;
  target_taproot_local._5_1_ = tapleaf_bit;
  target_taproot_local._6_1_ = has_parity;
  sVar2 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     nodes);
  if (sVar2 < 0x81) {
    TaprootScriptTree::TaprootScriptTree
              ((TaprootScriptTree *)local_e0,target_taproot_local._5_1_,local_30);
    if (tapleaf_hash != (ByteData256 *)0x0) {
      TaprootScriptTree::GetTapLeafHash(&local_f8,(TaprootScriptTree *)local_e0);
      ByteData256::operator=(tapleaf_hash,&local_f8);
      ByteData256::~ByteData256((ByteData256 *)0x494c44);
    }
    this = tapscript_local;
    __end2 = ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::begin
                       ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        tapscript_local);
    node = (ByteData256 *)
           ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::end
                     ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                      this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                                  *)&node);
      if (!bVar1) break;
      commitment = __gnu_cxx::
                   __normal_iterator<const_cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
                   ::operator*(&__end2);
      TaprootScriptTree::AddBranch((TaprootScriptTree *)local_e0,commitment);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::ByteData256_*,_std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>_>
      ::operator++(&__end2);
    }
    TapBranch::GetTapTweak
              ((ByteData256 *)&stack0xfffffffffffffec0,(TapBranch *)local_e0,
               (SchnorrPubkey *)nodes_local);
    target_taproot_local._7_1_ =
         SchnorrPubkey::IsTweaked
                   (internal_pubkey_local,(SchnorrPubkey *)nodes_local,
                    (ByteData256 *)&stack0xfffffffffffffec0,(bool)(target_taproot_local._6_1_ & 1));
    ByteData256::~ByteData256((ByteData256 *)0x494d32);
    TaprootScriptTree::~TaprootScriptTree(in_stack_fffffffffffffec0);
  }
  else {
    local_48.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_taproot.cpp"
                 ,0x2f);
    local_48.filename = local_48.filename + 1;
    local_48.line = 0x25d;
    local_48.funcname = "VerifyTaprootCommitment";
    tree.nodes_.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                              *)tapscript_local);
    logger::warn<unsigned_long>
              (&local_48,"control node maximum over. [{}]",
               (unsigned_long *)
               &tree.nodes_.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    target_taproot_local._7_1_ = 0;
  }
  return (bool)(target_taproot_local._7_1_ & 1);
}

Assistant:

bool TaprootUtil::VerifyTaprootCommitment(
    bool has_parity, uint8_t tapleaf_bit,
    const SchnorrPubkey& target_taproot,  // witness program
    const SchnorrPubkey& internal_pubkey,
    const std::vector<ByteData256>& nodes, const Script& tapscript,
    ByteData256* tapleaf_hash) {
  if (nodes.size() > TaprootScriptTree::kTaprootControlMaxNodeCount) {
    warn(CFD_LOG_SOURCE, "control node maximum over. [{}]", nodes.size());
    return false;
  }

  // Compute the tapleaf hash.
  TaprootScriptTree tree(tapleaf_bit, tapscript);
  if (tapleaf_hash != nullptr) *tapleaf_hash = tree.GetTapLeafHash();

  // Compute the Merkle root from the leaf and the provided path.
  for (const auto& node : nodes) {
    tree.AddBranch(node);
  }
  // Compute the tweak from the Merkle root and the inner pubkey.
  auto hash = tree.GetTapTweak(internal_pubkey);
  // Verify that the output pubkey matches the tweaked inner pubkey, after correcting for parity. // NOLINT
  return target_taproot.IsTweaked(internal_pubkey, hash, has_parity);
}